

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

double analyze(vector<double,_std::allocator<double>_> *values)

{
  double *pdVar1;
  double *pdVar2;
  pointer pdVar3;
  ostream *poVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  size_type __n;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 local_90 [8];
  vector<bool,_std::allocator<bool>_> excluded;
  vector<double,_std::allocator<double>_> diffs;
  vector<double,_std::allocator<double>_> dsqrs;
  double local_30;
  allocator_type local_19;
  
  pdVar1 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_30 = 0.0;
  for (pdVar5 = pdVar1; pdVar5 != pdVar2; pdVar5 = pdVar5 + 1) {
    local_30 = local_30 + *pdVar5;
  }
  lVar7 = (long)pdVar2 - (long)pdVar1;
  __n = lVar7 >> 3;
  excluded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_90,__n,
             (bool *)&excluded.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage,
             (allocator_type *)
             &diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &excluded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,
             (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,
             (allocator_type *)
             &diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_19);
  auVar10._8_4_ = (int)(lVar7 >> 0x23);
  auVar10._0_8_ = __n;
  auVar10._12_4_ = 0x45300000;
  dVar8 = local_30 /
          ((auVar10._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0));
  pdVar3 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
  for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
    dVar9 = pdVar3[lVar6] - dVar8;
    *(double *)
     (CONCAT71(excluded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage._1_7_,
               excluded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage._0_1_) + lVar6 * 8) = dVar9;
    diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage[lVar6] = dVar9 * dVar9;
  }
  dVar9 = 0.0;
  for (; diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage !=
         dsqrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
      diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage + 1) {
    dVar9 = dVar9 + *diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
  }
  lVar7 = lVar7 + -1;
  auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar11._0_8_ = lVar7;
  auVar11._12_4_ = 0x45300000;
  dVar9 = dVar9 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  std::operator<<((ostream *)&std::cerr,"sum: ");
  poVar4 = std::ostream::_M_insert<double>(local_30);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cerr,"size: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cerr,"average: ");
  poVar4 = std::ostream::_M_insert<double>(dVar8);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cerr,"range: ");
  poVar4 = std::ostream::_M_insert<double>(dVar9);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cerr,"range/average: ");
  poVar4 = std::ostream::_M_insert<double>(dVar9 / dVar8);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &excluded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)local_90);
  return dVar9;
}

Assistant:

double analyze(const std::vector<double>& values)
{
    double sum = std::accumulate(values.begin(), values.end(), 0.0);
    double average = sum/values.size();
    std::vector<bool> excluded(values.size(), false);

    std::vector<double> diffs(values.size());
    std::vector<double> dsqrs(values.size());
    for (size_t i = 0; i < values.size(); i++)
    {
        diffs[i] = values[i] - average;
        dsqrs[i] = diffs[i]*diffs[i];
    }
    double range = sqrt(std::accumulate(dsqrs.begin(), dsqrs.end(), 0.0)/(values.size() -1));

    int n = 0;
    std::cerr << "sum: " << sum << std::endl;
    std::cerr << "size: " << values.size() << std::endl;
    std::cerr << "average: " << average << std::endl;
    std::cerr << "range: " << range << std::endl;
    std::cerr << "range/average: " << range/average << std::endl;
    std::cerr << std::endl;
    for (size_t i = 0; i < values.size(); i++)
    {
        if (average - range < values[i] && average + range > values[i])
        {
            n++;
        }
    }

    return range;
}